

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void __thiscall Stat_scancycles::~Stat_scancycles(Stat_scancycles *this)

{
  FStat::~FStat(&this->super_FStat);
  operator_delete(this,0x20);
  return;
}

Assistant:

ADD_STAT (scancycles)
{
	FString out;
	double scancycles = WallScanCycles.Time();
	if (scancycles && scancycles < bestscancycles)
		bestscancycles = scancycles;
	out.Format ("%g", bestscancycles);
	return out;
}